

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O3

void __thiscall FMD3Model::BuildVertexBuffer(FMD3Model *this)

{
  MD3Surface *this_00;
  float *pfVar1;
  undefined8 uVar2;
  MD3TexCoord MVar3;
  MD3Surface *pMVar4;
  MD3TexCoord *pMVar5;
  uint uVar6;
  uint uVar7;
  FModelVertexBuffer *this_01;
  FModelVertex *pFVar8;
  uint *puVar9;
  MD3Triangle *pMVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  float *pfVar16;
  int iVar17;
  uint uVar18;
  
  if ((this->super_FModel).mVBuf != (FModelVertexBuffer *)0x0) {
    return;
  }
  LoadGeometry(this);
  if ((long)this->numSurfaces < 1) {
    iVar17 = this->numFrames;
    uVar14 = 0;
    uVar18 = 0;
  }
  else {
    iVar17 = this->numFrames;
    lVar13 = 0;
    uVar18 = 0;
    uVar14 = 0;
    do {
      uVar18 = uVar18 + *(int *)((long)&this->surfaces->numVertices + lVar13) * iVar17;
      uVar14 = uVar14 + *(int *)((long)&this->surfaces->numTriangles + lVar13) * 3;
      lVar13 = lVar13 + 0x38;
    } while ((long)this->numSurfaces * 0x38 - lVar13 != 0);
  }
  this_01 = (FModelVertexBuffer *)operator_new(0x28);
  FModelVertexBuffer::FModelVertexBuffer(this_01,true,iVar17 == 1);
  (this->super_FModel).mVBuf = this_01;
  pFVar8 = FModelVertexBuffer::LockVertexBuffer(this_01,uVar18);
  puVar9 = FModelVertexBuffer::LockIndexBuffer((this->super_FModel).mVBuf,uVar14);
  if ((pFVar8 != (FModelVertex *)0x0) && (puVar9 != (uint *)0x0)) {
    if (0 < this->numSurfaces) {
      lVar13 = 0;
      uVar18 = 0;
      uVar14 = 0;
      do {
        pMVar4 = this->surfaces;
        this_00 = pMVar4 + lVar13;
        pMVar4[lVar13].vindex = uVar18;
        pMVar4[lVar13].iindex = uVar14;
        iVar17 = pMVar4[lVar13].numVertices;
        uVar6 = this->numFrames * iVar17;
        if (0 < (int)uVar6) {
          pMVar5 = this_00->texcoords;
          pfVar16 = &this_00->vertices->y;
          uVar11 = 0;
          do {
            uVar7 = uVar18 + (int)uVar11;
            uVar2 = *(undefined8 *)pfVar16;
            MVar3 = pMVar5[(long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff)
                           % (long)iVar17 & 0xffffffff];
            pFVar8[uVar7].x = ((MD3Vertex *)(pfVar16 + -1))->x;
            pfVar1 = &pFVar8[uVar7].y;
            *pfVar1 = (float)((ulong)uVar2 >> 0x20);
            pfVar1[1] = (float)uVar2;
            pfVar1[2] = MVar3.s;
            pfVar1[3] = MVar3.t;
            uVar11 = uVar11 + 1;
            pfVar16 = pfVar16 + 6;
          } while (uVar6 != uVar11);
          uVar18 = uVar18 + (int)uVar11;
        }
        if (0 < this_00->numTriangles) {
          pMVar10 = this_00->tris;
          lVar12 = 0;
          do {
            uVar6 = uVar14;
            lVar15 = 0;
            do {
              puVar9[uVar6 + (int)lVar15] = pMVar10->VertIndex[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            lVar12 = lVar12 + 1;
            pMVar10 = pMVar10 + 1;
            uVar14 = uVar6 + 3;
          } while (lVar12 < this_00->numTriangles);
          uVar14 = uVar6 + 3;
        }
        MD3Surface::UnloadGeometry(this_00);
        lVar13 = lVar13 + 1;
      } while (lVar13 < this->numSurfaces);
    }
    FModelVertexBuffer::UnlockVertexBuffer((this->super_FModel).mVBuf);
    FModelVertexBuffer::UnlockIndexBuffer((this->super_FModel).mVBuf);
    return;
  }
  __assert_fail("vertptr != nullptr && indxptr != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/gl/models/gl_models_md3.cpp"
                ,0x114,"virtual void FMD3Model::BuildVertexBuffer()");
}

Assistant:

void FMD3Model::BuildVertexBuffer()
{
	if (mVBuf == nullptr)
	{
		LoadGeometry();

		unsigned int vbufsize = 0;
		unsigned int ibufsize = 0;

		for (int i = 0; i < numSurfaces; i++)
		{
			MD3Surface * surf = &surfaces[i];
			vbufsize += numFrames * surf->numVertices;
			ibufsize += 3 * surf->numTriangles;
		}

		mVBuf = new FModelVertexBuffer(true, numFrames == 1);
		FModelVertex *vertptr = mVBuf->LockVertexBuffer(vbufsize);
		unsigned int *indxptr = mVBuf->LockIndexBuffer(ibufsize);

		assert(vertptr != nullptr && indxptr != nullptr);

		unsigned int vindex = 0, iindex = 0;

		for (int i = 0; i < numSurfaces; i++)
		{
			MD3Surface * surf = &surfaces[i];

			surf->vindex = vindex;
			surf->iindex = iindex;
			for (int j = 0; j < numFrames * surf->numVertices; j++)
			{
				MD3Vertex* vert = surf->vertices + j;

				FModelVertex *bvert = &vertptr[vindex++];

				int tc = j % surf->numVertices;
				bvert->Set(vert->x, vert->z, vert->y, surf->texcoords[tc].s, surf->texcoords[tc].t);
				bvert->SetNormal(vert->nx, vert->nz, vert->ny);
			}

			for (int k = 0; k < surf->numTriangles; k++)
			{
				for (int l = 0; l < 3; l++)
				{
					indxptr[iindex++] = surf->tris[k].VertIndex[l];
				}
			}
			surf->UnloadGeometry();
		}
		mVBuf->UnlockVertexBuffer();
		mVBuf->UnlockIndexBuffer();
	}
}